

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void qt_qFindChildren_helper
               (QObject *parent,QAnyStringView name,QMetaObject *mo,QList<void_*> *list,
               FindChildOptions options)

{
  long lVar1;
  QAnyStringView name_00;
  QAnyStringView name_01;
  bool bVar2;
  QObjectList *list_00;
  const_iterator cVar3;
  QObject **ppQVar4;
  QObject *pQVar5;
  QObject *in_RCX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  undefined8 in_RDI;
  QMetaObject *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QObject *obj;
  QObjectList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff68;
  FindChildOption in_stack_ffffffffffffff6c;
  QList<QObject_*> *in_stack_ffffffffffffff70;
  QObject *obj_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QFlagsStorageHelper<Qt::FindChildOption,_4> local_4c;
  QObject **local_38;
  const_iterator local_30;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  list_00 = QObject::children((QObject *)0x3eec49);
  cVar3 = QList<QObject_*>::begin(in_stack_ffffffffffffff70);
  local_30.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QObject_*>::end(in_stack_ffffffffffffff70);
  while( true ) {
    local_38 = local_30.i;
    bVar2 = QList<QObject_*>::const_iterator::operator!=
                      ((const_iterator *)&stack0xffffffffffffffd8,local_30);
    if (!bVar2) break;
    ppQVar4 = QList<QObject_*>::const_iterator::operator*
                        ((const_iterator *)&stack0xffffffffffffffd8);
    obj_00 = *ppQVar4;
    pQVar5 = QMetaObject::cast((QMetaObject *)obj_00,
                               (QObject *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if ((pQVar5 != (QObject *)0x0) &&
       ((bVar2 = QAnyStringView::isNull((QAnyStringView *)&stack0xffffffffffffffe8), bVar2 ||
        (name_00.m_size._0_4_ = in_stack_ffffffffffffff98,
        name_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)in_RDI,
        name_00.m_size._4_4_ = in_stack_ffffffffffffff9c,
        bVar2 = matches_objectName_non_null(obj_00,name_00), bVar2)))) {
      QList<void_*>::append
                ((QList<void_*> *)0x3eed21,
                 (parameter_type)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    local_4c.super_QFlagsStorage<Qt::FindChildOption>.i =
         (QFlagsStorage<Qt::FindChildOption>)
         QFlags<Qt::FindChildOption>::operator&
                   ((QFlags<Qt::FindChildOption> *)obj_00,in_stack_ffffffffffffff6c);
    bVar2 = QFlags::operator_cast_to_bool((QFlags *)&local_4c);
    if (bVar2) {
      name_01.field_0._4_4_ = in_R9D;
      name_01.field_0._0_4_ = in_stack_ffffffffffffffe0;
      name_01.m_size = (size_t)in_RSI.m_data;
      uVar6 = in_R9D;
      qt_qFindChildren_helper
                (in_RCX,name_01,in_R8,(QList<void_*> *)list_00,
                 (QFlagsStorageHelper<Qt::FindChildOption,_4>)SUB84((ulong)cVar3.i >> 0x20,0));
      in_stack_ffffffffffffff9c = in_R9D;
      in_R9D = uVar6;
    }
    QList<QObject_*>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_qFindChildren_helper(const QObject *parent, QAnyStringView name,
                             const QMetaObject &mo, QList<void*> *list, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    Q_ASSERT(list);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
            list->append(obj);
        if (options & Qt::FindChildrenRecursively)
            qt_qFindChildren_helper(obj, name, mo, list, options);
    }
}